

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,BranchInst *br,bool param_2)

{
  Value *pVVar1;
  BasicBlock *this_00;
  Value *local_38;
  BasicBlock *local_30;
  BasicBlock *local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"br ",3);
  pVVar1 = BranchInst::getCondition(br);
  if (pVVar1 == (Value *)0x0) {
    this_00 = BranchInst::getSuccessor(br,0);
    local_38 = (Value *)Value::get_tween_id(&this_00->super_Value);
    append<char_const(&)[8],unsigned_long>(this,(char (*) [8])"label %",(unsigned_long *)&local_38);
  }
  else {
    local_38 = BranchInst::getCondition(br);
    local_28 = BranchInst::getSuccessor(br,0);
    local_30 = BranchInst::getSuccessor(br,1);
    append<LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*,char_const(&)[3],LLVMBC::BasicBlock*>
              (this,&local_38,(char (*) [3])", ",&local_28,(char (*) [3])", ",&local_30);
  }
  return;
}

Assistant:

void StreamState::append(BranchInst *br, bool)
{
	append("br ");
	if (br->getCondition())
		append(br->getCondition(), ", ", br->getSuccessor(0), ", ", br->getSuccessor(1));
	else
		append(br->getSuccessor(0));
}